

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Api.cpp
# Opt level: O2

void __thiscall xmrig::Api::exec(Api *this,IApiRequest *request)

{
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  pointer ppIVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t sVar4;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  uint64_t uVar5;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined8 uVar6;
  pointer ppIVar7;
  Value features;
  StringRefType local_f0;
  StringRefType local_e0;
  StringRefType local_d0;
  StringRefType local_c0;
  StringRefType local_b0;
  StringRefType local_a0;
  StringRefType local_90;
  StringRefType local_80;
  StringRefType local_70;
  StringRefType local_60;
  StringRefType local_50;
  StringRefType local_40;
  
  iVar2 = (*request->_vptr_IApiRequest[0xe])(request);
  if (iVar2 == 1) {
    iVar2 = (*request->_vptr_IApiRequest[0xc])(request);
    allocator = *(MemoryPoolAllocator<rapidjson::CrtAllocator> **)
                 (CONCAT44(extraout_var,iVar2) + 0x10);
    (*request->_vptr_IApiRequest[2])(request);
    iVar2 = (*request->_vptr_IApiRequest[0xd])(request);
    local_40.s = "id";
    local_40.length = 2;
    local_50.s = this->m_id;
    sVar4 = strlen(local_50.s);
    local_50.length = (SizeType)sVar4;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)CONCAT44(extraout_var_00,iVar2),&local_40,&local_50,allocator);
    iVar2 = (*request->_vptr_IApiRequest[0xd])(request);
    local_60.s = "worker_id";
    local_60.length = 9;
    local_70.s = this->m_workerId;
    sVar4 = strlen(local_70.s);
    local_70.length = (SizeType)sVar4;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)CONCAT44(extraout_var_01,iVar2),&local_60,&local_70,allocator);
    iVar2 = (*request->_vptr_IApiRequest[0xd])(request);
    local_80.s = "uptime";
    local_80.length = 6;
    uVar5 = Chrono::currentMSecsSinceEpoch();
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<unsigned_long>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)CONCAT44(extraout_var_02,iVar2),&local_80,(uVar5 - this->m_timestamp) / 1000,
               allocator);
    iVar2 = (*request->_vptr_IApiRequest[0xd])(request);
    local_90.s = "restricted";
    local_90.length = 10;
    iVar3 = (*request->_vptr_IApiRequest[6])(request);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<bool>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)CONCAT44(extraout_var_03,iVar2),&local_90,SUB41(iVar3,0),allocator);
    features.data_.n = (Number)0x0;
    features.data_.s.str = (Ch *)0x4000000000000;
    local_a0.s = "api";
    local_a0.length = 3;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    PushBack(&features,&local_a0,allocator);
    local_b0.s = "http";
    local_b0.length = 4;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    PushBack(&features,&local_b0,allocator);
    local_c0.s = "hwloc";
    local_c0.length = 5;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    PushBack(&features,&local_c0,allocator);
    local_d0.s = "tls";
    local_d0.length = 3;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    PushBack(&features,&local_d0,allocator);
    local_e0.s = "opencl";
    local_e0.length = 6;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    PushBack(&features,&local_e0,allocator);
    iVar2 = (*request->_vptr_IApiRequest[0xd])(request);
    local_f0.s = "features";
    local_f0.length = 8;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)CONCAT44(extraout_var_04,iVar2),&local_f0,&features,allocator);
  }
  ppIVar7 = (this->m_listeners).
            super__Vector_base<xmrig::IApiListener_*,_std::allocator<xmrig::IApiListener_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppIVar1 = (this->m_listeners).
            super__Vector_base<xmrig::IApiListener_*,_std::allocator<xmrig::IApiListener_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  do {
    if (ppIVar7 == ppIVar1) {
      iVar2 = (*request->_vptr_IApiRequest[5])(request);
      uVar6 = 200;
      if ((char)iVar2 != '\0') {
        uVar6 = 0x194;
      }
      (*request->_vptr_IApiRequest[0x10])(request,uVar6);
      return;
    }
    (*(*ppIVar7)->_vptr_IApiListener[2])(*ppIVar7,request);
    iVar2 = (*request->_vptr_IApiRequest[4])(request);
    ppIVar7 = ppIVar7 + 1;
  } while ((char)iVar2 == '\0');
  return;
}

Assistant:

void xmrig::Api::exec(IApiRequest &request)
{
    using namespace rapidjson;

    if (request.type() == IApiRequest::REQ_SUMMARY) {
        auto &allocator = request.doc().GetAllocator();

        request.accept();
        request.reply().AddMember("id",         StringRef(m_id),       allocator);
        request.reply().AddMember("worker_id",  StringRef(m_workerId), allocator);
        request.reply().AddMember("uptime",     (Chrono::currentMSecsSinceEpoch() - m_timestamp) / 1000, allocator);
        request.reply().AddMember("restricted", request.isRestricted(), allocator);

        Value features(kArrayType);
#       ifdef XMRIG_FEATURE_API
        features.PushBack("api", allocator);
#       endif
#       ifdef XMRIG_FEATURE_HTTP
        features.PushBack("http", allocator);
#       endif
#       ifdef XMRIG_FEATURE_LIBCPUID
        features.PushBack("cpuid", allocator);
#       endif
#       ifdef XMRIG_FEATURE_HWLOC
        features.PushBack("hwloc", allocator);
#       endif
#       ifdef XMRIG_FEATURE_TLS
        features.PushBack("tls", allocator);
#       endif
#       ifdef XMRIG_FEATURE_OPENCL
        features.PushBack("opencl", allocator);
#       endif
        request.reply().AddMember("features", features, allocator);
    }

    for (IApiListener *listener : m_listeners) {
        listener->onRequest(request);

        if (request.isDone()) {
            return;
        }
    }

    request.done(request.isNew() ? HTTP_STATUS_NOT_FOUND : HTTP_STATUS_OK);
}